

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

void tcase_add_fixture(TCase *tc,SFun setup,SFun teardown,int ischecked)

{
  List *pLVar1;
  Fixture *pFVar2;
  int ischecked_local;
  SFun teardown_local;
  SFun setup_local;
  TCase *tc_local;
  
  if (setup != (SFun)0x0) {
    if (ischecked == 0) {
      pLVar1 = tc->unch_sflst;
      pFVar2 = fixture_create(setup,0);
      check_list_add_end(pLVar1,pFVar2);
    }
    else {
      pLVar1 = tc->ch_sflst;
      pFVar2 = fixture_create(setup,ischecked);
      check_list_add_end(pLVar1,pFVar2);
    }
  }
  if (teardown != (SFun)0x0) {
    if (ischecked == 0) {
      pLVar1 = tc->unch_tflst;
      pFVar2 = fixture_create(teardown,0);
      check_list_add_front(pLVar1,pFVar2);
    }
    else {
      pLVar1 = tc->ch_tflst;
      pFVar2 = fixture_create(teardown,ischecked);
      check_list_add_front(pLVar1,pFVar2);
    }
  }
  return;
}

Assistant:

static void tcase_add_fixture(TCase * tc, SFun setup, SFun teardown,
                              int ischecked)
{
    if(setup)
    {
        if(ischecked)
            check_list_add_end(tc->ch_sflst,
                               fixture_create(setup, ischecked));
        else
            check_list_add_end(tc->unch_sflst,
                               fixture_create(setup, ischecked));
    }

    /* Add teardowns at front so they are run in reverse order. */
    if(teardown)
    {
        if(ischecked)
            check_list_add_front(tc->ch_tflst,
                                 fixture_create(teardown, ischecked));
        else
            check_list_add_front(tc->unch_tflst,
                                 fixture_create(teardown, ischecked));
    }
}